

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void VW::copy_example_data(bool audit,example *dst,example *src)

{
  uchar **ppuVar1;
  example *in_RDX;
  long in_RSI;
  namespace_index c;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  undefined7 in_stack_ffffffffffffffc8;
  features *this;
  v_array<unsigned_char> *in_stack_ffffffffffffffd8;
  features *pfVar2;
  example *in_stack_ffffffffffffffe0;
  example *peVar3;
  
  copy_example_metadata(SUB81((ulong)in_RSI >> 0x38,0),in_RDX,in_stack_ffffffffffffffe0);
  copy_array<unsigned_char>
            ((v_array<unsigned_char> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  peVar3 = in_RDX;
  ppuVar1 = v_array<unsigned_char>::begin((v_array<unsigned_char> *)in_RDX);
  pfVar2 = (features *)*ppuVar1;
  ppuVar1 = v_array<unsigned_char>::end((v_array<unsigned_char> *)in_RDX);
  this = (features *)*ppuVar1;
  for (; pfVar2 != this; pfVar2 = (features *)((long)&(pfVar2->values)._begin + 1)) {
    features::deep_copy_from
              (this,(features *)
                    CONCAT17(*(uchar *)&(pfVar2->values)._begin,in_stack_ffffffffffffffc8));
  }
  *(size_t *)(in_RSI + 0x68a0) = peVar3->num_features;
  *(float *)(in_RSI + 0x68b4) = peVar3->total_sum_feat_sq;
  return;
}

Assistant:

void copy_example_data(bool audit, example* dst, example* src)
{
  // std::cerr << "copy_example_data dst = " << dst << std::endl;
  copy_example_metadata(audit, dst, src);

  // copy feature data
  copy_array(dst->indices, src->indices);
  for (namespace_index c : src->indices) dst->feature_space[c].deep_copy_from(src->feature_space[c]);
  // copy_array(dst->atomics[i], src->atomics[i]);
  dst->num_features = src->num_features;
  dst->total_sum_feat_sq = src->total_sum_feat_sq;
}